

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint adler32(uchar *data,uint len)

{
  uint uVar1;
  uint in_ESI;
  uchar *in_RDI;
  
  uVar1 = update_adler32(1,in_RDI,in_ESI);
  return uVar1;
}

Assistant:

static unsigned adler32(const unsigned char* data, unsigned len) {
  return update_adler32(1u, data, len);
}